

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_CopyOneof_Test::
~ReflectionOpsTest_CopyOneof_Test(ReflectionOpsTest_CopyOneof_Test *this)

{
  ReflectionOpsTest_CopyOneof_Test *this_local;
  
  ~ReflectionOpsTest_CopyOneof_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ReflectionOpsTest, CopyOneof) {
  unittest::TestOneof2 message, message2;
  TestUtil::SetOneof1(&message);
  ReflectionOps::Copy(message, &message2);
  TestUtil::ExpectOneofSet1(message2);

  TestUtil::SetOneof2(&message);
  TestUtil::ExpectOneofSet2(message);
  ReflectionOps::Copy(message, &message2);
  TestUtil::ExpectOneofSet2(message2);
}